

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_impl.h
# Opt level: O0

void __thiscall AddrInfo::AddrInfo(AddrInfo *this,CAddress *addrIn,CNetAddr *addrSource)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  *in_stack_ffffffffffffff68;
  CAddress *in_stack_ffffffffffffff70;
  CAddress *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::CAddress(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  s<(char)48>();
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            (in_stack_ffffffffffffff68,(duration *)0x885a48);
  s<(char)48>();
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            (in_stack_ffffffffffffff68,(duration *)0x885a83);
  CNetAddr::CNetAddr((CNetAddr *)in_stack_ffffffffffffff78,(CNetAddr *)in_stack_ffffffffffffff70);
  s<(char)48>();
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            (in_stack_ffffffffffffff68,(duration *)0x885ad2);
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined1 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0xffffffff;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo(const CAddress &addrIn, const CNetAddr &addrSource) : CAddress(addrIn), source(addrSource)
    {
    }